

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.c
# Opt level: O1

pa_simple * pulseaudio_initialize(uchar channels_number,char *appname)

{
  pa_simple *ppVar1;
  pa_sample_spec ss;
  undefined8 local_c;
  uchar local_4;
  
  local_c = 0xbb8000000003;
  if (appname == (char *)0x0) {
    appname = "AIS Demodulator";
  }
  local_4 = channels_number;
  ppVar1 = (pa_simple *)pa_simple_new(0,appname,2,0,"AIS data",&local_c,0,0,0);
  return ppVar1;
}

Assistant:

pa_simple *pulseaudio_initialize(unsigned char channels_number, const char *appname) {

    pa_simple *s;
    pa_sample_spec ss;

    ss.format = PA_SAMPLE_S16NE;
    ss.channels = channels_number;
    ss.rate = 48000;

    s = pa_simple_new(NULL,
                      (appname != NULL) ? appname : "AIS Demodulator",
                      PA_STREAM_RECORD, NULL, "AIS data", &ss, NULL, NULL, NULL);

    return s;
}